

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O0

int Kit_SopAnyLiteral(Kit_Sop_t *cSop,int nLits)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int local_28;
  int nLitsCur;
  int k;
  int i;
  uint uCube;
  int nLits_local;
  Kit_Sop_t *cSop_local;
  
  nLitsCur = 0;
  while( true ) {
    if (nLits <= nLitsCur) {
      return -1;
    }
    local_2c = 0;
    local_28 = 0;
    while( true ) {
      iVar1 = Kit_SopCubeNum(cSop);
      bVar2 = false;
      if (local_28 < iVar1) {
        k = Kit_SopCube(cSop,local_28);
        bVar2 = k != 0;
      }
      if (!bVar2) break;
      iVar1 = Kit_CubeHasLit(k,nLitsCur);
      if (iVar1 != 0) {
        local_2c = local_2c + 1;
      }
      local_28 = local_28 + 1;
    }
    if (1 < local_2c) break;
    nLitsCur = nLitsCur + 1;
  }
  return nLitsCur;
}

Assistant:

int Kit_SopAnyLiteral( Kit_Sop_t * cSop, int nLits )
{
    unsigned uCube;
    int i, k, nLitsCur;
    // go through each literal
    for ( i = 0; i < nLits; i++ )
    {
        // go through all the cubes
        nLitsCur = 0;
        Kit_SopForEachCube( cSop, uCube, k )
            if ( Kit_CubeHasLit(uCube, i) )
                nLitsCur++;
        if ( nLitsCur > 1 )
            return i;
    }
    return -1;
}